

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  u8 uVar4;
  short sVar5;
  Vdbe *p;
  Table *pTVar6;
  WhereLoop *p_00;
  sqlite3 *db;
  SrcList *pSVar7;
  int *piVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  Expr *pEVar17;
  Index *pIdx;
  CollSeq *pCVar18;
  int iVar19;
  WhereTerm *pWVar20;
  char *pcVar21;
  uint uVar22;
  Op *pOVar23;
  WhereTerm *pWVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  Expr *local_c0;
  long local_a8;
  char *zNotUsed;
  code *local_58;
  code *local_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  p = pParse->pVdbe;
  iVar25 = 0;
  iVar12 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  pTVar6 = pSrc->pTab;
  pWVar24 = pWC->a;
  pWVar20 = pWVar24 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar27 = 0xffffffffffffffff;
    local_c0 = (Expr *)0x0;
  }
  else {
    iVar25 = 0;
    uVar27 = 0;
    bVar9 = false;
    local_c0 = (Expr *)0x0;
    do {
      if (((p_00->prereq == 0) && ((pWVar24->wtFlags & 2) == 0)) &&
         (pEVar17 = pWVar24->pExpr, (pEVar17->flags & 1) == 0)) {
        local_38.n = pSrc->iCursor;
        local_3c = '\x03';
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        if (pEVar17 != (Expr *)0x0) {
          walkExpr((Walker *)&zNotUsed,pEVar17);
        }
        if (local_3c != '\0') {
          db = pParse->db;
          if (pEVar17 == (Expr *)0x0) {
            pEVar17 = (Expr *)0x0;
          }
          else {
            pEVar17 = exprDup(db,pEVar17,0,(u8 **)0x0);
          }
          local_c0 = sqlite3ExprAnd(db,local_c0,pEVar17);
        }
      }
      iVar13 = termCanDriveIndex(pWVar24,pSrc,notReady);
      if (iVar13 == 0) {
LAB_0018acf1:
        bVar10 = true;
      }
      else {
        iVar13 = (pWVar24->u).leftColumn;
        uVar29 = 1L << ((byte)iVar13 & 0x3f);
        if (0x3f < (long)iVar13) {
          uVar29 = 0x8000000000000000;
        }
        if (!bVar9) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar6->zName,pTVar6->aCol[iVar13].zName);
        }
        bVar9 = true;
        if ((uVar29 & uVar27) != 0) goto LAB_0018acf1;
        iVar13 = whereLoopResize(pParse->db,p_00,iVar25 + 1);
        if (iVar13 == 0) {
          p_00->aLTerm[iVar25] = pWVar24;
          uVar27 = uVar27 | uVar29;
          bVar9 = true;
          bVar10 = true;
          iVar25 = iVar25 + 1;
        }
        else {
          bVar9 = true;
          bVar10 = false;
        }
      }
      if (!bVar10) goto LAB_0018b277;
      pWVar24 = pWVar24 + 1;
    } while (pWVar24 < pWVar20);
    uVar27 = ~uVar27 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)iVar25;
  (p_00->u).btree.nEq = (u16)iVar25;
  p_00->wsFlags = 0x4241;
  uVar27 = uVar27 & pSrc->colUsed;
  sVar5 = pTVar6->nCol;
  uVar22 = (uint)sVar5;
  uVar15 = 0x3f;
  if (sVar5 < 0x3f) {
    uVar15 = uVar22;
  }
  if (0 < (int)uVar22) {
    uVar29 = 0;
    do {
      iVar25 = iVar25 + (uint)((uVar27 >> (uVar29 & 0x3f) & 1) != 0);
      uVar29 = uVar29 + 1;
    } while (uVar15 != uVar29);
  }
  iVar13 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar13 = uVar22 - 0x3e;
  }
  uVar29 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar13 + iVar25),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar6;
    pWVar24 = pWC->a;
    if (pWVar24 < pWVar20) {
      uVar29 = 0;
      uVar30 = 0;
      do {
        iVar14 = termCanDriveIndex(pWVar24,pSrc,notReady);
        if (iVar14 != 0) {
          iVar14 = (pWVar24->u).leftColumn;
          uVar26 = 1L << ((byte)iVar14 & 0x3f);
          if (0x3f < iVar14) {
            uVar26 = 0x8000000000000000;
          }
          if ((uVar26 & uVar30) == 0) {
            pEVar17 = pWVar24->pExpr;
            iVar19 = (int)uVar29;
            pIdx->aiColumn[iVar19] = (i16)iVar14;
            pCVar18 = sqlite3BinaryCompareCollSeq(pParse,pEVar17->pLeft,pEVar17->pRight);
            pcVar21 = "BINARY";
            if (pCVar18 != (CollSeq *)0x0) {
              pcVar21 = pCVar18->zName;
            }
            uVar30 = uVar30 | uVar26;
            pIdx->azColl[iVar19] = pcVar21;
            uVar29 = (ulong)(iVar19 + 1);
          }
        }
        pWVar24 = pWVar24 + 1;
      } while (pWVar24 < pWVar20);
    }
    if (0 < sVar5) {
      uVar30 = 0;
      do {
        if ((uVar27 >> (uVar30 & 0x3f) & 1) != 0) {
          iVar14 = (int)uVar29;
          pIdx->aiColumn[iVar14] = (i16)uVar30;
          pIdx->azColl[iVar14] = "BINARY";
          uVar29 = (ulong)(iVar14 + 1);
        }
        uVar30 = uVar30 + 1;
      } while (uVar15 != uVar30);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar6->nCol)) {
      uVar29 = (ulong)(int)uVar29;
      iVar14 = 0x3f;
      do {
        pIdx->aiColumn[uVar29] = (i16)iVar14;
        pIdx->azColl[uVar29] = "BINARY";
        uVar29 = uVar29 + 1;
        iVar14 = iVar14 + 1;
      } while (iVar14 < pTVar6->nCol);
    }
    iVar28 = (int)uVar29;
    pIdx->aiColumn[iVar28] = -1;
    pIdx->azColl[iVar28] = "BINARY";
    iVar14 = pParse->nTab;
    pParse->nTab = iVar14 + 1;
    pLevel->iIdxCur = iVar14;
    iVar19 = 0;
    sqlite3VdbeAddOp3(p,0x70,iVar14,iVar13 + iVar25,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    pSVar7 = pWC->pWInfo->pTabList;
    bVar3 = pLevel->iFrom;
    if ((pSVar7->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      iVar25 = pLevel->iTabCur;
      iVar13 = 0x24;
    }
    else {
      iVar25 = pSVar7->a[bVar3].regReturn;
      iVar19 = sqlite3VdbeAddOp3(p,0x46,0,0,0);
      sqlite3VdbeAddOp3(p,0xd,iVar25,0,pSVar7->a[bVar3].addrFillSub);
      iVar13 = 0xe;
    }
    iVar25 = sqlite3VdbeAddOp3(p,iVar13,iVar25,0,0);
    if (local_c0 == (Expr *)0x0) {
      local_a8 = -1;
    }
    else {
      uVar15 = sqlite3VdbeMakeLabel(p);
      sqlite3ExprIfFalse(pParse,local_c0,uVar15,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
      local_a8 = (long)(int)~uVar15;
    }
    if (pParse->nTempReg == '\0') {
      iVar13 = pParse->nMem + 1;
      pParse->nMem = iVar13;
    }
    else {
      bVar11 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar11;
      iVar13 = pParse->aTempReg[bVar11];
    }
    iVar16 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar13,0,(int *)0x0,(Index *)0x0,0)
    ;
    sqlite3VdbeAddOp3(p,0x85,pLevel->iIdxCur,iVar13,0);
    iVar14 = p->nOp;
    if (0 < (long)iVar14) {
      p->aOp[(long)iVar14 + -1].p5 = 0x10;
    }
    if ((local_c0 != (Expr *)0x0) && (piVar8 = p->pParse->aLabel, piVar8 != (int *)0x0)) {
      piVar8[local_a8] = iVar14;
    }
    if ((pSVar7->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      sqlite3VdbeAddOp3(p,5,pLevel->iTabCur,iVar25 + 1,0);
    }
    else {
      if (iVar19 < 0) {
        iVar19 = p->nOp + -1;
      }
      if (p->db->mallocFailed == '\0') {
        pOVar23 = p->aOp + iVar19;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = iVar16 + iVar28;
      translateColumnToCopy(pParse,iVar25,pLevel->iTabCur,pSVar7->a[bVar3].regResult,1);
      sqlite3VdbeAddOp3(p,0xb,0,iVar25,0);
      puVar2 = &pSVar7->a[bVar3].fg.field_0x1;
      *puVar2 = *puVar2 & 0xef;
    }
    iVar14 = p->nOp;
    if (0 < (long)iVar14) {
      p->aOp[(long)iVar14 + -1].p5 = 3;
    }
    uVar4 = p->db->mallocFailed;
    if (uVar4 == '\0') {
      iVar19 = iVar14 + -1;
      if (-1 < iVar25) {
        iVar19 = iVar25;
      }
      pOVar23 = p->aOp + iVar19;
    }
    else {
      pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar23->p2 = iVar14;
    if (iVar13 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar13;
      }
    }
    if (uVar4 == '\0') {
      iVar25 = p->nOp + -1;
      if (-1 < iVar12) {
        iVar25 = iVar12;
      }
      pOVar23 = p->aOp + iVar25;
    }
    else {
      pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar23->p2 = p->nOp;
  }
LAB_0018b277:
  if (local_c0 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_c0);
  }
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(v);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}